

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O3

void QCoreApplicationPrivate::sendPostedEvents(QObject *receiver,int event_type,QThreadData *data)

{
  int *piVar1;
  QAtomicInt *pQVar2;
  qsizetype *pqVar3;
  QEvent *event;
  QObject *receiver_00;
  QThreadData *pQVar4;
  long lVar5;
  QPostEvent *pQVar6;
  iterator abegin;
  uint uVar7;
  int iVar8;
  int iVar9;
  qsizetype qVar10;
  long in_FS_OFFSET;
  QPostEvent local_88;
  QObject *local_68;
  uint local_60;
  undefined4 uStack_5c;
  QThreadData *pQStack_58;
  long local_50;
  unique_lock<QMutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = 0;
  if (event_type != -1) {
    uVar7 = event_type;
  }
  if ((receiver != (QObject *)0x0) && ((QThreadData *)(receiver->d_ptr).d[1].q_ptr != data)) {
    sendPostedEvents();
    goto LAB_00275d78;
  }
  piVar1 = &(data->postEventList).recursion;
  *piVar1 = *piVar1 + 1;
  local_48._M_device = &(data->postEventList).mutex;
  local_48._M_owns = false;
  local_48._9_7_ = 0xaaaaaaaaaaaaaa;
  std::unique_lock<QMutex>::lock(&local_48);
  local_48._M_owns = true;
  lVar5 = (data->postEventList).super_QList<QPostEvent>.d.size;
  data->canWait = lVar5 == 0;
  if (lVar5 != 0) {
    if (receiver == (QObject *)0x0) {
LAB_00275b34:
      data->canWait = true;
      qVar10 = (data->postEventList).startOffset;
      (data->postEventList).insertionOffset = lVar5;
      _local_60 = CONCAT44(0xaaaaaaaa,uVar7);
      local_50._0_1_ = 1;
      local_50._1_7_ = 0xaaaaaaaaaaaaaa;
      local_68 = receiver;
      pQStack_58 = data;
LAB_00275b8b:
      do {
        pQVar4 = pQStack_58;
        if (uVar7 == 0 && receiver == (QObject *)0x0) {
          lVar5 = (data->postEventList).startOffset;
          if (((data->postEventList).super_QList<QPostEvent>.d.size <= lVar5) ||
             ((data->postEventList).insertionOffset <= lVar5)) goto LAB_00275cf5;
          pQVar6 = (data->postEventList).super_QList<QPostEvent>.d.ptr + lVar5;
          (data->postEventList).startOffset = lVar5 + 1;
        }
        else {
          if (((data->postEventList).super_QList<QPostEvent>.d.size <= qVar10) ||
             ((data->postEventList).insertionOffset <= qVar10)) goto LAB_00275cf5;
          pQVar6 = (data->postEventList).super_QList<QPostEvent>.d.ptr + qVar10;
          qVar10 = qVar10 + 1;
        }
        event = pQVar6->event;
      } while (event == (QEvent *)0x0);
      receiver_00 = pQVar6->receiver;
      if ((receiver == (QObject *)0x0) || (receiver_00 == receiver)) {
        if ((uVar7 == 0) || (uVar7 == event->t)) {
          if (event->t == 0x34) {
            iVar8 = *(int *)((long)&event[1]._vptr_QEvent + 4) + *(int *)&event[1]._vptr_QEvent;
            iVar9 = data->scopeLevel + data->loopLevel;
            if (((iVar8 <= iVar9) && (*(int *)&event[1]._vptr_QEvent != 0 || data->loopLevel < 1))
               && (iVar8 != iVar9 || uVar7 != 0x34)) {
              if (uVar7 == 0 && receiver == (QObject *)0x0) {
                local_88.receiver = pQVar6->receiver;
                local_88.event = pQVar6->event;
                local_88.priority = pQVar6->priority;
                local_88._20_4_ = *(undefined4 *)&pQVar6->field_0x14;
                pQVar6->event = (QEvent *)0x0;
                QPostEventList::addEvent(&data->postEventList,&local_88);
              }
              goto LAB_00275b8b;
            }
          }
          event->m_posted = false;
          LOCK();
          pQVar2 = &((receiver_00->d_ptr).d)->postedEvents;
          (pQVar2->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i =
               (pQVar2->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          pQVar6->event = (QEvent *)0x0;
          std::unique_lock<QMutex>::unlock(&local_48);
          event->m_spont = false;
          QCoreApplication::notifyInternal2(receiver_00,event);
          (*event->_vptr_QEvent[1])(event);
          std::unique_lock<QMutex>::lock(&local_48);
          goto LAB_00275b8b;
        }
      }
      data->canWait = false;
      goto LAB_00275b8b;
    }
    if ((((receiver->d_ptr).d)->postedEvents).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i != 0) {
      lVar5 = (data->postEventList).super_QList<QPostEvent>.d.size;
      goto LAB_00275b34;
    }
  }
  piVar1 = &(data->postEventList).recursion;
  *piVar1 = *piVar1 + -1;
  goto LAB_00275d6e;
LAB_00275cf5:
  local_50 = (ulong)local_50._1_7_ << 8;
  piVar1 = &(pQStack_58->postEventList).recursion;
  *piVar1 = *piVar1 + -1;
  if ((*piVar1 == 0) &&
     ((pQStack_58->canWait == false &&
      ((pQStack_58->eventDispatcher).super_QBasicAtomicPointer<QAbstractEventDispatcher>._q_value.
       _M_b._M_p != (__pointer_type)0x0)))) {
    (*(((pQStack_58->eventDispatcher).super_QBasicAtomicPointer<QAbstractEventDispatcher>._q_value.
        _M_b._M_p)->super_QObject)._vptr_QObject[0x14])();
  }
  if (((local_60 == 0) && (local_68 == (QObject *)0x0)) &&
     (-1 < (pQVar4->postEventList).startOffset)) {
    abegin = QList<QPostEvent>::begin(&(pQVar4->postEventList).super_QList<QPostEvent>);
    QList<QPostEvent>::erase
              (&(pQVar4->postEventList).super_QList<QPostEvent>,(const_iterator)abegin.i,
               abegin.i + (pQVar4->postEventList).startOffset);
    pqVar3 = &(pQVar4->postEventList).insertionOffset;
    *pqVar3 = *pqVar3 - (pQVar4->postEventList).startOffset;
    (pQVar4->postEventList).startOffset = 0;
  }
LAB_00275d6e:
  std::unique_lock<QMutex>::~unique_lock(&local_48);
LAB_00275d78:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCoreApplicationPrivate::sendPostedEvents(QObject *receiver, int event_type,
                                               QThreadData *data)
{
    if (event_type == -1) {
        // we were called by an obsolete event dispatcher.
        event_type = 0;
    }

    if (receiver && receiver->d_func()->threadData.loadRelaxed() != data) {
        qWarning("QCoreApplication::sendPostedEvents: Cannot send "
                 "posted events for objects in another thread");
        return;
    }

    ++data->postEventList.recursion;

    auto locker = qt_unique_lock(data->postEventList.mutex);

    // by default, we assume that the event dispatcher can go to sleep after
    // processing all events. if any new events are posted while we send
    // events, canWait will be set to false.
    data->canWait = (data->postEventList.size() == 0);

    if (data->postEventList.size() == 0
            || (receiver && !receiver->d_func()->postedEvents.loadAcquire())) {
        --data->postEventList.recursion;
        return;
    }

    data->canWait = true;

    // okay. here is the tricky loop. be careful about optimizing
    // this, it looks the way it does for good reasons.
    qsizetype startOffset = data->postEventList.startOffset;
    qsizetype &i = (!event_type && !receiver) ? data->postEventList.startOffset : startOffset;
    data->postEventList.insertionOffset = data->postEventList.size();

    // Exception-safe cleaning up without the need for a try/catch block
    struct CleanUp {
        Q_DISABLE_COPY_MOVE(CleanUp)

        QObject *receiver;
        int event_type;
        QThreadData *data;
        bool exceptionCaught;

        inline CleanUp(QObject *receiver, int event_type, QThreadData *data) :
            receiver(receiver), event_type(event_type), data(data), exceptionCaught(true)
        {}
        inline ~CleanUp()
        {
            if (exceptionCaught) {
                // since we were interrupted, we need another pass to make sure we clean everything up
                data->canWait = false;
            }

            --data->postEventList.recursion;
            if (!data->postEventList.recursion && !data->canWait && data->hasEventDispatcher())
                data->eventDispatcher.loadRelaxed()->wakeUp();

            // clear the global list, i.e. remove everything that was
            // delivered.
            if (!event_type && !receiver && data->postEventList.startOffset >= 0) {
                const QPostEventList::iterator it = data->postEventList.begin();
                data->postEventList.erase(it, it + data->postEventList.startOffset);
                data->postEventList.insertionOffset -= data->postEventList.startOffset;
                Q_ASSERT(data->postEventList.insertionOffset >= 0);
                data->postEventList.startOffset = 0;
            }
        }
    };
    CleanUp cleanup(receiver, event_type, data);

    while (i < data->postEventList.size()) {
        // avoid live-lock
        if (i >= data->postEventList.insertionOffset)
            break;

        const QPostEvent &pe = data->postEventList.at(i);
        ++i;

        if (!pe.event)
            continue;
        if ((receiver && receiver != pe.receiver) || (event_type && event_type != pe.event->type())) {
            data->canWait = false;
            continue;
        }

        if (pe.event->type() == QEvent::DeferredDelete) {
            // DeferredDelete events are sent either
            // 1) when the event loop that posted the event has returned; or
            // 2) if explicitly requested (with QEvent::DeferredDelete) for
            //    events posted by the current event loop; or
            // 3) if the event was posted before the outermost event loop.

            const int eventLoopLevel = static_cast<QDeferredDeleteEvent *>(pe.event)->loopLevel();
            const int eventScopeLevel = static_cast<QDeferredDeleteEvent *>(pe.event)->scopeLevel();

            const bool postedBeforeOutermostLoop = eventLoopLevel == 0;
            const bool allowDeferredDelete =
                (eventLoopLevel + eventScopeLevel > data->loopLevel + data->scopeLevel
                 || (postedBeforeOutermostLoop && data->loopLevel > 0)
                 || (event_type == QEvent::DeferredDelete
                     && eventLoopLevel + eventScopeLevel == data->loopLevel + data->scopeLevel));
            if (!allowDeferredDelete) {
                // cannot send deferred delete
                if (!event_type && !receiver) {
                    // we must copy it first; we want to re-post the event
                    // with the event pointer intact, but we can't delay
                    // nulling the event ptr until after re-posting, as
                    // addEvent may invalidate pe.
                    QPostEvent pe_copy = pe;

                    // null out the event so if sendPostedEvents recurses, it
                    // will ignore this one, as it's been re-posted.
                    const_cast<QPostEvent &>(pe).event = nullptr;

                    // re-post the copied event so it isn't lost
                    data->postEventList.addEvent(pe_copy);
                }
                continue;
            }
        }

        // first, we diddle the event so that we can deliver
        // it, and that no one will try to touch it later.
        pe.event->m_posted = false;
        QEvent *e = pe.event;
        QObject * r = pe.receiver;

        r->d_func()->postedEvents.fetchAndSubAcquire(1);
        Q_ASSERT(r->d_func()->postedEvents >= 0);

        // next, update the data structure so that we're ready
        // for the next event.
        const_cast<QPostEvent &>(pe).event = nullptr;

        locker.unlock();
        const auto relocker = qScopeGuard([&locker] { locker.lock(); });

        const std::unique_ptr<QEvent> event_deleter(e); // will delete the event (with the mutex unlocked)

        // after all that work, it's time to deliver the event.
        QCoreApplication::sendEvent(r, e);

        // careful when adding anything below this point - the
        // sendEvent() call might invalidate any invariants this
        // function depends on.
    }

    cleanup.exceptionCaught = false;
}